

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

bool __thiscall
ctemplate::TemplateCache::IsValidTemplateFilename
          (TemplateCache *this,string *filename,string *resolved_filename,FileStat *statbuf)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = ResolveTemplateFilename(this,filename,resolved_filename,statbuf);
  if (bVar1) {
    if (((statbuf->internal_statbuf).st_mode & 0xf000) != 0x4000) {
      return true;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
    poVar2 = std::operator<<(poVar2,(string *)resolved_filename);
    poVar2 = std::operator<<(poVar2,"is a directory and thus not readable");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
    poVar2 = std::operator<<(poVar2,"Unable to locate file ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool TemplateCache::IsValidTemplateFilename(const string& filename,
                                            string* resolved_filename,
                                            FileStat* statbuf) const {
  if (!ResolveTemplateFilename(filename,
                               resolved_filename,
                               statbuf)) {
    LOG(WARNING) << "Unable to locate file " << filename << endl;
    return false;
  }
  if (statbuf->IsDirectory()) {
    LOG(WARNING) << *resolved_filename
                 << "is a directory and thus not readable" << endl;
    return false;
  }
  return true;
}